

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdPubkeyTweakMul(void *handle,char *pubkey,char *tweak,char **output)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  undefined1 local_90 [32];
  Pubkey key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ByteData256 tweak_data;
  
  cfd::Initialize();
  if (output == (char **)0x0) {
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x5c9;
    local_90._16_8_ = "CfdPubkeyTweakMul";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_90,"Failed to parameter. output is null.",(allocator *)&key);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(tweak);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_90,pubkey,(allocator *)&tweak_data);
      cfd::core::Pubkey::Pubkey(&key,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::string((string *)local_90,tweak,(allocator *)&local_58);
      cfd::core::ByteData256::ByteData256(&tweak_data,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      cfd::core::Pubkey::CreateTweakMul((Pubkey *)&local_58,&key,&tweak_data);
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_90,(Pubkey *)&local_58);
      pcVar2 = cfd::capi::CreateString((string *)local_90);
      *output = pcVar2;
      std::__cxx11::string::~string((string *)local_90);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_data);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      return 0;
    }
    local_90._0_8_ = "cfdcapi_key.cpp";
    local_90._8_4_ = 0x5d5;
    local_90._16_8_ = "CfdPubkeyTweakMul";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"tweak is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_90,"Failed to parameter. tweak is null or empty.",(allocator *)&key);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_90._0_8_ = "cfdcapi_key.cpp";
  local_90._8_4_ = 0x5cf;
  local_90._16_8_ = "CfdPubkeyTweakMul";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"pubkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_90,"Failed to parameter. pubkey is null or empty.",(allocator *)&key);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_90);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdPubkeyTweakMul(
    void* handle, const char* pubkey, const char* tweak, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    Pubkey key(pubkey);
    ByteData256 tweak_data(tweak);
    *output = CreateString(key.CreateTweakMul(tweak_data).GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}